

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsecontext.cpp
# Opt level: O0

void __thiscall FParseContext::AddSym(FParseContext *this,char *sym,int val)

{
  undefined1 local_70 [8];
  FParseSymbol syme;
  int val_local;
  char *sym_local;
  FParseContext *this_local;
  
  local_70._0_4_ = val;
  syme.Sym._72_4_ = val;
  unique0x10000062 = sym;
  strncpy(local_70 + 4,sym,0x4f);
  syme.Sym[0x47] = '\0';
  TArray<FParseSymbol,_FParseSymbol>::Push(&this->symbols,(FParseSymbol *)local_70);
  return;
}

Assistant:

void FParseContext::AddSym (char *sym, int val)
{
	FParseSymbol syme;
	syme.Value = val;
	strncpy (syme.Sym, sym, 79);
	syme.Sym[79]=0;
	symbols.Push(syme);
}